

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# keytap2.cpp
# Opt level: O3

bool clusterSimple(TSimilarityMap *sim,TValueCC tholdCC,TKeyPressCollection *keyPresses)

{
  double *pdVar1;
  pointer psVar2;
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  TClusterId *icid;
  long lVar6;
  TClusterId *pTVar7;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  int iVar11;
  ulong uVar12;
  TClusterId *pTVar13;
  int iVar14;
  uint uVar15;
  float fVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  
  auVar3 = _DAT_00115030;
  psVar2 = (keyPresses->super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
           ).super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
           _M_impl.super__Vector_impl_data._M_start;
  uVar15 = (int)((long)(keyPresses->
                       super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>)
                       .
                       super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish - (long)psVar2 >> 4) * -0x55555555
  ;
  if (0 < (int)uVar15) {
    uVar8 = (ulong)(uVar15 + 3 & 0xfffffffc);
    lVar9 = (ulong)(uVar15 & 0x7fffffff) - 1;
    auVar17._8_4_ = (int)lVar9;
    auVar17._0_8_ = lVar9;
    auVar17._12_4_ = (int)((ulong)lVar9 >> 0x20);
    pTVar7 = &psVar2[3].cid;
    auVar17 = auVar17 ^ _DAT_00115030;
    auVar18 = _DAT_00115010;
    auVar19 = _DAT_00115020;
    do {
      auVar20 = auVar19 ^ auVar3;
      iVar11 = auVar17._4_4_;
      if ((bool)(~(auVar20._4_4_ == iVar11 && auVar17._0_4_ < auVar20._0_4_ ||
                  iVar11 < auVar20._4_4_) & 1)) {
        pTVar7[-0x24] = 0;
      }
      if ((auVar20._12_4_ != auVar17._12_4_ || auVar20._8_4_ <= auVar17._8_4_) &&
          auVar20._12_4_ <= auVar17._12_4_) {
        pTVar7[-0x18] = 0;
      }
      auVar20 = auVar18 ^ auVar3;
      iVar14 = auVar20._4_4_;
      if (iVar14 <= iVar11 && (iVar14 != iVar11 || auVar20._0_4_ <= auVar17._0_4_)) {
        pTVar7[-0xc] = 0;
        *pTVar7 = 0;
      }
      lVar9 = auVar19._8_8_;
      auVar19._0_8_ = auVar19._0_8_ + 4;
      auVar19._8_8_ = lVar9 + 4;
      lVar9 = auVar18._8_8_;
      auVar18._0_8_ = auVar18._0_8_ + 4;
      auVar18._8_8_ = lVar9 + 4;
      pTVar7 = pTVar7 + 0x30;
      uVar8 = uVar8 - 4;
    } while (uVar8 != 0);
  }
  iVar11 = 0;
  iVar14 = 0;
  do {
    do {
      iVar4 = rand();
      iVar5 = rand();
      iVar4 = iVar4 % (int)uVar15;
      iVar5 = iVar5 % (int)uVar15;
    } while (iVar4 == iVar5);
    lVar9 = *(long *)&(sim->
                      super__Vector_base<std::vector<stMatch,_std::allocator<stMatch>_>,_std::allocator<std::vector<stMatch,_std::allocator<stMatch>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start[iVar4].
                      super__Vector_base<stMatch,_std::allocator<stMatch>_>._M_impl.
                      super__Vector_impl_data;
    lVar6 = (long)iVar5 * 0x10;
    pdVar1 = (double *)(lVar9 + lVar6);
    if (tholdCC < *pdVar1 || tholdCC == *pdVar1) {
      psVar2 = (keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      fVar16 = frand();
      if ((double)fVar16 < *(double *)(lVar9 + lVar6)) {
        pTVar7 = &psVar2[iVar4].cid;
        pTVar13 = &psVar2[iVar5].cid;
        iVar4 = *pTVar7;
        if (*pTVar13 == 0 && iVar4 == 0) {
          iVar11 = iVar11 + 1;
          *pTVar13 = iVar11;
          *pTVar7 = iVar11;
        }
        else if (iVar4 == 0) {
          *pTVar7 = *pTVar13;
        }
        else {
          *pTVar13 = iVar4;
        }
      }
    }
    iVar14 = iVar14 + 1;
  } while (iVar14 != 1000000);
  if (0 < (int)uVar15) {
    uVar8 = (ulong)(uVar15 & 0x7fffffff);
    pTVar7 = &((keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start)->cid;
    do {
      iVar14 = iVar11 + 1;
      iVar4 = *pTVar7;
      if (*pTVar7 == 0) {
        iVar11 = iVar14;
        iVar4 = iVar14;
      }
      *pTVar7 = -iVar4;
      pTVar7 = pTVar7 + 0xc;
      uVar8 = uVar8 - 1;
    } while (uVar8 != 0);
    if (0 < (int)uVar15) {
      psVar2 = (keyPresses->
               super_vector<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>).
               super__Vector_base<stKeyPressData<short>,_std::allocator<stKeyPressData<short>_>_>.
               _M_impl.super__Vector_impl_data._M_start;
      pTVar7 = &psVar2->cid;
      uVar10 = 0;
      iVar11 = 0;
      uVar8 = (ulong)(uVar15 & 0x7fffffff);
      do {
        if (psVar2[uVar10].cid < 1) {
          uVar12 = uVar8;
          pTVar13 = pTVar7;
          do {
            if (*pTVar13 == psVar2[uVar10].cid) {
              *pTVar13 = iVar11;
            }
            pTVar13 = pTVar13 + 0xc;
            uVar12 = uVar12 - 1;
          } while (uVar12 != 0);
          iVar11 = iVar11 + 1;
        }
        uVar10 = uVar10 + 1;
        pTVar7 = pTVar7 + 0xc;
        uVar8 = uVar8 - 1;
      } while (uVar10 != (uVar15 & 0x7fffffff));
    }
  }
  return true;
}

Assistant:

bool clusterSimple(const TSimilarityMap & sim, TValueCC tholdCC, TKeyPressCollection & keyPresses) {
    int n = keyPresses.size();
    for (int i = 0; i < n; ++i) {
        auto & cid = keyPresses[i].cid;

        cid = 0;
    }

    int curId = 0;

    int nIter = 1000000;
    for (int iter = 0; iter < nIter; ++iter) {
        int i = rand()%n;
        int j = rand()%n;
        while (i == j) {
            i = rand()%n;
            j = rand()%n;
        }

        auto & icid = keyPresses[i].cid;
        auto & jcid = keyPresses[j].cid;

        //if (icid != 0 && jcid != 0) continue;

        auto & cc = sim[i][j].cc;

        if (cc < tholdCC) continue;
        auto r = frand();
        if (r < cc) {
            if (icid == jcid && icid == 0) {
                icid = jcid = ++curId;
            } else if (icid == 0) {
                icid = jcid;
            } else {
                jcid = icid;
            }
        }

        //if (icid == jcid) {
        //    //if (std::pow(r, 1.0) > cc) {
        //    //    icid = i + 1;
        //    //    jcid = j + 1;
        //    //}
        //} else {
        //    if (std::pow(r, 1.0) < cc) {
        //        icid = jcid;
        //    }
        //}
    }

    for (int i = 0; i < n; ++i) {
        auto & icid = keyPresses[i].cid;

        if (icid == 0) icid = ++curId;
        icid = -icid;
    }

    curId = 0;
    for (int i = 0; i < n; ++i) {
        auto & icid = keyPresses[i].cid;

        if (icid > 0) continue;
        for (int j = i; j < n; ++j) {
            auto & jcid = keyPresses[j].cid;

            if (jcid == icid) {
                jcid = curId;
            }
        }
        ++curId;
    }

    return true;
}